

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::Matcher
          (Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits> *this,string_ref query,
          MatcherOptions *opts)

{
  pointer pcVar1;
  Iterator first;
  char cVar2;
  pointer pcVar3;
  long lVar4;
  pointer pcVar5;
  
  (this->super_MatchInfo)._vptr_MatchInfo = (_func_int **)&PTR__Matcher_0014ab78;
  (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->item_basename_)._M_current = (char32_t *)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->qit_basename_)._M_current = (char32_t *)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  decode<cpsm::Utf8StringTraits>(&this->query_,query);
  pcVar3 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->query_basename_)._M_current = pcVar3;
  lVar4 = (long)pcVar1 - (long)pcVar3 >> 4;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    pcVar3 = pcVar3 + 2;
    do {
      pcVar5 = pcVar3;
      cVar2 = u_hasBinaryProperty_70(pcVar5[-2],0x1e);
      if (cVar2 != '\0') {
        pcVar5 = pcVar5 + -2;
        goto LAB_001368b9;
      }
      cVar2 = u_hasBinaryProperty_70(pcVar5[-1],0x1e);
      if (cVar2 != '\0') {
        pcVar5 = pcVar5 + -1;
        goto LAB_001368b9;
      }
      cVar2 = u_hasBinaryProperty_70(*pcVar5,0x1e);
      if (cVar2 != '\0') goto LAB_001368b9;
      cVar2 = u_hasBinaryProperty_70(pcVar5[1],0x1e);
      if (cVar2 != '\0') {
        pcVar5 = pcVar5 + 1;
        goto LAB_001368b9;
      }
      lVar4 = lVar4 + -1;
      pcVar3 = pcVar5 + 4;
    } while (1 < lVar4);
    pcVar3 = pcVar5 + 2;
  }
  lVar4 = (long)pcVar1 - (long)pcVar3 >> 2;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pcVar5 = pcVar1;
      if ((lVar4 != 3) ||
         (cVar2 = u_hasBinaryProperty_70(*pcVar3,0x1e), pcVar5 = pcVar3, cVar2 != '\0'))
      goto LAB_001368b9;
      pcVar3 = pcVar3 + 1;
    }
    cVar2 = u_hasBinaryProperty_70(*pcVar3,0x1e);
    pcVar5 = pcVar3;
    if (cVar2 != '\0') goto LAB_001368b9;
    pcVar3 = pcVar3 + 1;
  }
  cVar2 = u_hasBinaryProperty_70(*pcVar3,0x1e);
  pcVar5 = pcVar3;
  if (cVar2 == '\0') {
    pcVar5 = pcVar1;
  }
LAB_001368b9:
  this->case_sensitive_ = pcVar5 != pcVar1;
  decode<cpsm::Utf8StringTraits>(&this->crfile_,opts->crfile);
  first._M_current =
       (this->crfile_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->crfile_basename_)._M_current = first._M_current;
  (this->crfile_ext_)._M_current = first._M_current;
  find_word_endings(&this->crfile_basename_word_ends_,first,first);
  this->match_crfile_ = opts->match_crfile;
  return;
}

Assistant:

explicit Matcher(boost::string_ref const query, MatcherOptions const& opts)
      // Queries are smartcased (case-sensitive only if any uppercase appears
      // in the query).
      : query_(decode<StringTraits>(query)),
        query_basename_(path_basename<PathTraits>(query_.cbegin(),
                                                  query_.cend())),
        case_sensitive_(std::any_of(query_.cbegin(), query_.cend(),
                                    StringTraits::is_uppercase)),
        crfile_(decode<StringTraits>(opts.crfile)),
        crfile_basename_(path_basename<PathTraits>(crfile_.cbegin(),
                                                   crfile_.cend())),
        crfile_ext_(std::find_if(crfile_.crbegin(),
                                 ReverseIterator(crfile_basename_),
                                 PathTraits::is_extension_separator).base()),
        crfile_basename_word_ends_(find_word_endings(crfile_basename_,
                                                     crfile_ext_)),
        match_crfile_(opts.match_crfile) {}